

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_declare_function
          (irGenerator *this,string *_name,SymbolKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  mapped_type mVar3;
  int iVar4;
  undefined1 auVar5 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  mapped_type *pmVar6;
  FunctionTy *this_03;
  MirFunction *this_04;
  iterator iVar7;
  mapped_type *pmVar8;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_06;
  string name;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_> params;
  anon_class_1_0_00000001 local_1bd;
  SymbolKind local_1bc;
  undefined1 local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined8 local_198;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *local_190;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178;
  undefined7 uStack_177;
  undefined1 local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  element_type *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  shared_ptr<mir::inst::MirFunction> local_138;
  shared_ptr<mir::types::FunctionTy> local_128;
  SharedTyPtr local_118;
  string local_108;
  string local_e8;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_c8;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_b0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_58;
  undefined8 local_40;
  uint32_t local_38;
  
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168;
  local_188 = &local_178;
  local_180 = 0;
  local_178 = 0;
  local_c8.
  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  vStack_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = this->_InitLocalVarId;
  uVar2 = this->_InitTmpVarId;
  local_40 = CONCAT44(uVar1,uVar2);
  local_38 = 0;
  local_190 = &this->_funcNameToFuncData;
  local_1bc = kind;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](local_190,_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)pmVar6,&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&pmVar6->_freeList,&vStack_58);
  pmVar6->_frontInstsNum = local_38;
  pmVar6->_nowTmpId = (undefined4)local_40;
  pmVar6->_nowLocalValueId = local_40._4_4_;
  if (local_1bc == INT) {
    local_1b8 = (undefined1  [8])operator_new(8);
    (((IntTy *)local_1b8)->super_Ty).super_Displayable._vptr_Displayable =
         (_func_int **)&PTR_display_001ecd58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),(IntTy *)local_1b8);
  }
  else {
    local_98 = (element_type *)0x0;
    this_06._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_1bc != VID) goto LAB_00182434;
    local_1b8 = (undefined1  [8])operator_new(8);
    (((VoidTy *)local_1b8)->super_Ty).super_Displayable._vptr_Displayable =
         (_func_int **)&PTR_display_001ecdb0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),(VoidTy *)local_1b8);
  }
  local_98 = (element_type *)local_1b8;
  this_06._M_pi = _Stack_1b0._M_pi;
LAB_00182434:
  p_Stack_90 = this_06._M_pi;
  std::__cxx11::string::_M_assign((string *)&local_188);
  this_03 = (FunctionTy *)operator_new(0x38);
  local_118.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
  local_118.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_90;
  if (this_06._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_06._M_pi)->_M_use_count = (this_06._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_06._M_pi)->_M_use_count = (this_06._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  vector(&local_b0,&local_c8);
  mir::types::FunctionTy::FunctionTy(this_03,&local_118,&local_b0,false);
  local_1b8 = (undefined1  [8])this_03;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::FunctionTy*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),this_03);
  this_01._M_pi = _Stack_1b0._M_pi;
  auVar5 = local_1b8;
  _local_1b8 = (_Variadic_union<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                )0x0;
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  ~vector(&local_b0);
  if (local_118.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this_04 = (MirFunction *)operator_new(0x98);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_188,local_188 + local_180);
  local_128.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar5;
  local_128.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_01._M_pi;
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)((long)this_01._M_pi + 8) = *(_Atomic_word *)((long)this_01._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)((long)this_01._M_pi + 8) = *(_Atomic_word *)((long)this_01._M_pi + 8) + 1;
    }
  }
  mir::inst::MirFunction::MirFunction(this_04,&local_e8,&local_128);
  local_1b8 = (undefined1  [8])this_04;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::MirFunction*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),this_04);
  this_02._M_pi = _Stack_1b0._M_pi;
  auVar5 = local_1b8;
  _local_1b8 = (_Variadic_union<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                )0x0;
  if (local_128.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_188,local_188 + local_180);
  local_138.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar5;
  local_138.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_02._M_pi;
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)((long)this_02._M_pi + 8) = *(_Atomic_word *)((long)this_02._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)((long)this_02._M_pi + 8) = *(_Atomic_word *)((long)this_02._M_pi + 8) + 1;
    }
  }
  insertFunc(this,&local_108,&local_138);
  if (local_138.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->_funcStack,(value_type *)((long)auVar5 + 8));
  this_00 = &(this->_package).functions;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::find(&this_00->_M_t,
                 (this->_funcStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  local_148 = (element_type *)operator_new(8);
  ((Displayable *)&(local_148->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
       (_func_int **)&PTR_display_001ecdb0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::VoidTy*>
            (&local_140,(VoidTy *)local_148);
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
    }
  }
  local_1b8._0_4_ = this->_VoidVarId;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_display_001ecf68;
  local_1a8 = local_148;
  local_1a0._M_pi = local_140._M_pi;
  local_198._0_1_ = false;
  local_198._1_1_ = false;
  local_198._2_1_ = false;
  local_198._3_1_ = 0;
  local_198._4_4_ = 0;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::_M_emplace_unique<std::pair<int,mir::inst::Variable>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
              *)&iVar7._M_node[3]._M_right,(pair<int,_mir::inst::Variable> *)local_1b8);
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_display_001ecf68;
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  mVar3 = this->_VoidVarId;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](local_190,
                        (this->_funcStack).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&pmVar6->_localValueNameToId,&this->_VoidVarName);
  *pmVar8 = mVar3;
  if (local_1bc == INT) {
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
            ::find(&this_00->_M_t,
                   (this->_funcStack).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_158 = (element_type *)operator_new(8);
    ((Displayable *)&(local_158->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
         (_func_int **)&PTR_display_001ecd58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              (&local_150,(IntTy *)local_158);
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
      }
    }
    local_1b8._0_4_ = this->_ReturnVarId;
    _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_display_001ecf68;
    local_1a8 = local_158;
    local_1a0._M_pi = local_150._M_pi;
    local_198._0_1_ = false;
    local_198._1_1_ = false;
    local_198._2_1_ = false;
    local_198._3_1_ = 0;
    local_198._4_4_ = 0;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
    ::_M_emplace_unique<std::pair<int,mir::inst::Variable>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
                *)&iVar7._M_node[3]._M_right,(pair<int,_mir::inst::Variable> *)local_1b8);
    _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_display_001ecf68;
    if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
    }
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
    }
    mVar3 = this->_ReturnVarId;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](local_190,
                          (this->_funcStack).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&pmVar6->_localValueNameToId,&this->_ReturnVarName);
    *pmVar8 = mVar3;
  }
  this_05 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  local_168 = (undefined1  [8])operator_new(4);
  iVar4 = this->_nowLabelId;
  this->_nowLabelId = iVar4 + 1;
  ((JumpLabelId *)local_168)->_jumpLabelId = iVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::irGenerator::JumpLabelId*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),(JumpLabelId *)local_168)
  ;
  _Stack_1b0._M_pi = _Stack_160._M_pi;
  local_1b8 = local_168;
  _local_168 = (undefined1  [16])0x0;
  local_1a8 = (element_type *)CONCAT71(local_1a8._1_7_,2);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_05,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_1b8);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
    ::_S_vtable._M_arr[(ulong)local_1a8 & 0xff]._M_data)
            (&local_1bd,
             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)local_1b8);
  local_1a8 = (element_type *)CONCAT71(local_1a8._1_7_,0xff);
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_88);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  ~vector(&local_c8);
  if (this_06._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_06._M_pi);
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
  return;
}

Assistant:

void irGenerator::ir_declare_function(string _name, symbol::SymbolKind kind) {
  string name;
  shared_ptr<mir::inst::MirFunction> func;
  shared_ptr<FunctionTy> type;
  SharedTyPtr ret;
  std::vector<SharedTyPtr> params;
  FunctionData functionData;

  functionData._nowLocalValueId = _InitLocalVarId;
  functionData._nowTmpId = _InitTmpVarId;
  functionData._frontInstsNum = 0;
  _funcNameToFuncData[_name] = functionData;

  switch (kind) {
    case front::symbol::SymbolKind::INT:
      ret = SharedTyPtr(new IntTy());
      break;
    case front::symbol::SymbolKind::VID:
      ret = SharedTyPtr(new VoidTy());
      break;
    default:
      break;
  }
  name = _name;
  type = shared_ptr<FunctionTy>(new FunctionTy(ret, params, false));
  func = shared_ptr<mir::inst::MirFunction>(
      new mir::inst::MirFunction(name, type));

  insertFunc(name, func);
  _funcStack.push_back(func->name);

  _package.functions.find(_funcStack.back())
      ->second.variables.insert(std::pair(
          _VoidVarId, Variable(SharedTyPtr(new VoidTy()), false, false)));
  _funcNameToFuncData[_funcStack.back()]._localValueNameToId[_VoidVarName] =
      _VoidVarId;
  if (kind == front::symbol::SymbolKind::INT) {
    _package.functions.find(_funcStack.back())
        ->second.variables.insert(std::pair(
            _ReturnVarId, Variable(SharedTyPtr(new IntTy()), false, false)));
    _funcNameToFuncData[_funcStack.back()]._localValueNameToId[_ReturnVarName] =
        _ReturnVarId;
  }
  _funcNameToInstructions[_funcStack.back()].push_back(
      shared_ptr<JumpLabelId>(new JumpLabelId(getNewLabelId())));
}